

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall JetHead::vector<URI::QueryParam>::clear(vector<URI::QueryParam> *this)

{
  QueryParam *pQVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->mSize != 0) {
    lVar4 = 0x30;
    uVar5 = 0;
    do {
      pQVar1 = this->mData;
      plVar2 = (long *)((long)&(pQVar1->mKey)._M_dataplus._M_p + lVar4);
      plVar3 = *(long **)((long)pQVar1 + lVar4 + -0x10);
      if (plVar2 != plVar3) {
        operator_delete(plVar3,*plVar2 + 1);
      }
      plVar3 = (long *)((long)pQVar1 + lVar4 + -0x20);
      plVar2 = *(long **)((long)pQVar1 + lVar4 + -0x30);
      if (plVar3 != plVar2) {
        operator_delete(plVar2,*plVar3 + 1);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < this->mSize);
  }
  this->mSize = 0;
  return;
}

Assistant:

void clear() 
		{ 
			// Call destructor-in-place, not delete (we didn't
			// allocate this object with new).  Destroy everything.
			for (unsigned i = 0; i < mSize; i++)
			{
				mData[i].~T();
			}

			// Nothing is left
			mSize = 0; 
		}